

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O3

void __thiscall
NLReaderTest_OnUnhandledDispatch_Test::TestBody(NLReaderTest_OnUnhandledDispatch_Test *this)

{
  FunctionMocker<void_(const_char_*)> *pFVar1;
  MockSpec<void_(const_char_*)> *pMVar2;
  MockNLHandler handler;
  long *local_400;
  long local_3f8;
  long local_3f0 [2];
  undefined2 local_3e0;
  long *local_3d8;
  long local_3d0;
  long local_3c8 [2];
  long *local_3b8 [2];
  long local_3a8 [2];
  undefined2 local_398;
  Matcher<const_char_*> local_390;
  MockNLHandler local_378;
  
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"NL header","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x64f,"handler","OnUnhandled(testing::StrEq(\"NL header\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"NL header");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"objective","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x650,"handler","OnUnhandled(testing::StrEq(\"objective\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"objective");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"nonlinear constraint","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x651,"handler","OnUnhandled(testing::StrEq(\"nonlinear constraint\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"nonlinear constraint");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"logical constraint","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x652,"handler","OnUnhandled(testing::StrEq(\"logical constraint\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"logical constraint");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"common expression","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x653,"handler","OnUnhandled(testing::StrEq(\"common expression\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"common expression");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"common expression","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x654,"handler","OnUnhandled(testing::StrEq(\"common expression\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"common expression");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3d8,"complementarity constraint","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x656,"handler","OnUnhandled(testing::StrEq(\"complementarity constraint\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"complementarity constraint");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"linear objective","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x657,"handler","OnUnhandled(testing::StrEq(\"linear objective\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"linear objective");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"linear constraint","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x658,"handler","OnUnhandled(testing::StrEq(\"linear constraint\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"linear constraint");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3d8,"linear common expression","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x659,"handler","OnUnhandled(testing::StrEq(\"linear common expression\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"linear common expression");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"variable bounds","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x65a,"handler","OnUnhandled(testing::StrEq(\"variable bounds\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"variable bounds");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"constraint bounds","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x65b,"handler","OnUnhandled(testing::StrEq(\"constraint bounds\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"constraint bounds");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"initial value","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x65c,"handler","OnUnhandled(testing::StrEq(\"initial value\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"initial value");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"initial dual value","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x65d,"handler","OnUnhandled(testing::StrEq(\"initial dual value\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"initial dual value");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"column sizes","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x65e,"handler","OnUnhandled(testing::StrEq(\"column sizes\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"column sizes");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"function","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x65f,"handler","OnUnhandled(testing::StrEq(\"function\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"function");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"integer suffix","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x660,"handler","OnUnhandled(testing::StrEq(\"integer suffix\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"integer suffix");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"double suffix","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x661,"handler","OnUnhandled(testing::StrEq(\"double suffix\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"double suffix");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"number","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x662,"handler","OnUnhandled(testing::StrEq(\"number\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"number");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"variable reference","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x663,"handler","OnUnhandled(testing::StrEq(\"variable reference\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"variable reference");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3d8,"common expression reference","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x664,"handler","OnUnhandled(testing::StrEq(\"common expression reference\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"common expression reference");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"unary expression","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x665,"handler","OnUnhandled(testing::StrEq(\"unary expression\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"unary expression");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"binary expression","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x667,"handler","OnUnhandled(testing::StrEq(\"binary expression\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"binary expression");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"if expression","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x668,"handler","OnUnhandled(testing::StrEq(\"if expression\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"if expression");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"piecewise-linear term","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x669,"handler","OnUnhandled(testing::StrEq(\"piecewise-linear term\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"piecewise-linear term");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"piecewise-linear term","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x66b,"handler","OnUnhandled(testing::StrEq(\"piecewise-linear term\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"piecewise-linear term");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"call expression","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x66c,"handler","OnUnhandled(testing::StrEq(\"call expression\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"call expression");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"call expression","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x66d,"handler","OnUnhandled(testing::StrEq(\"call expression\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"call expression");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"vararg expression","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x66e,"handler","OnUnhandled(testing::StrEq(\"vararg expression\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"vararg expression");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"vararg expression","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x670,"handler","OnUnhandled(testing::StrEq(\"vararg expression\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"vararg expression");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"summation","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x671,"handler","OnUnhandled(testing::StrEq(\"summation\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"summation");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"summation","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x672,"handler","OnUnhandled(testing::StrEq(\"summation\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"summation");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"count expression","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x673,"handler","OnUnhandled(testing::StrEq(\"count expression\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"count expression");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"count expression","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x675,"handler","OnUnhandled(testing::StrEq(\"count expression\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"count expression");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"numberof expression","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x676,"handler","OnUnhandled(testing::StrEq(\"numberof expression\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"numberof expression");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"numberof expression","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x678,"handler","OnUnhandled(testing::StrEq(\"numberof expression\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"numberof expression");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3d8,"symbolic numberof expression","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x67a,"handler","OnUnhandled(testing::StrEq(\"symbolic numberof expression\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"symbolic numberof expression");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3d8,"symbolic numberof expression","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x67c,"handler","OnUnhandled(testing::StrEq(\"symbolic numberof expression\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"symbolic numberof expression");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"bool","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x67d,"handler","OnUnhandled(testing::StrEq(\"bool\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"bool");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"logical not","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x67e,"handler","OnUnhandled(testing::StrEq(\"logical not\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"logical not");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3d8,"binary logical expression","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x680,"handler","OnUnhandled(testing::StrEq(\"binary logical expression\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"binary logical expression");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"relational expression","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x682,"handler","OnUnhandled(testing::StrEq(\"relational expression\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"relational expression");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3d8,"logical count expression","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x684,"handler","OnUnhandled(testing::StrEq(\"logical count expression\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"logical count expression");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"implication expression","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x686,"handler","OnUnhandled(testing::StrEq(\"implication expression\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"implication expression");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3d8,"iterated logical expression","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x688,"handler","OnUnhandled(testing::StrEq(\"iterated logical expression\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"iterated logical expression");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3d8,"iterated logical expression","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x68a,"handler","OnUnhandled(testing::StrEq(\"iterated logical expression\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"iterated logical expression");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"pairwise expression","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x68c,"handler","OnUnhandled(testing::StrEq(\"pairwise expression\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"pairwise expression");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"pairwise expression","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x68e,"handler","OnUnhandled(testing::StrEq(\"pairwise expression\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"pairwise expression");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"string","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x68f,"handler","OnUnhandled(testing::StrEq(\"string\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"string");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  MockNLHandler::MockNLHandler(&local_378);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"symbolic if expression","");
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3d8,local_3d0 + (long)local_3d8);
  local_3e0 = 0x101;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_400,local_3f8 + (long)local_400);
  local_398 = local_3e0;
  if (local_400 != local_3f0) {
    operator_delete(local_400,local_3f0[0] + 1);
  }
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_390,(PolymorphicMatcher *)local_3b8);
  pFVar1 = &local_378.gmock1_OnUnhandled_63;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_378);
  pMVar2 = testing::internal::FunctionMocker<void_(const_char_*)>::With(pFVar1,&local_390);
  testing::internal::MockSpec<void_(const_char_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x691,"handler","OnUnhandled(testing::StrEq(\"symbolic if expression\"))");
  local_390.super_MatcherBase<const_char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f0348;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_char_*>_>::~linked_ptr
            (&local_390.super_MatcherBase<const_char_*>.impl_);
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  MockNLHandler::OnUnhandled(&local_378,"symbolic if expression");
  local_378.super_NLHandler<MockNLHandler,_BasicTestExpr<0>_>._vptr_NLHandler =
       (_func_int **)&PTR__MockNLHandler_002f01e8;
  testing::internal::FunctionMockerBase<void_()>::~FunctionMockerBase
            (&local_378.gmock0_EndInput_70.super_FunctionMockerBase<void_()>);
  testing::internal::
  FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  ::~FunctionMockerBase
            (&local_378.gmock2_OnLinearObjExpr_69.
              super_FunctionMockerBase<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            );
  testing::internal::FunctionMockerBase<bool_(int)>::~FunctionMockerBase
            (&local_378.gmockconst1_NeedObj_67.super_FunctionMockerBase<bool_(int)>);
  testing::internal::FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::
  ~FunctionMockerBase(&local_378.gmock3_OnObj_66.
                       super_FunctionMockerBase<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>);
  testing::internal::FunctionMockerBase<void_(int,_double,_double)>::~FunctionMockerBase
            (&local_378.gmock3_OnVarBounds_65.super_FunctionMockerBase<void_(int,_double,_double)>);
  testing::internal::FunctionMockerBase<void_(const_mp::NLHeader_&)>::~FunctionMockerBase
            (&local_378.gmock1_OnHeader_64.super_FunctionMockerBase<void_(const_mp::NLHeader_&)>);
  testing::internal::FunctionMockerBase<void_(const_char_*)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(const_char_*)>);
  return;
}

Assistant:

TEST(NLReaderTest, OnUnhandledDispatch) {
  EXPECT_UNHANDLED("NL header", OnHeader(mp::NLHeader()));
  EXPECT_UNHANDLED("objective", OnObj(0, mp::obj::MAX, TestExpr()));
  EXPECT_UNHANDLED("nonlinear constraint", OnAlgebraicCon(0, TestExpr()));
  EXPECT_UNHANDLED("logical constraint", OnLogicalCon(0, TestExpr()));
  EXPECT_UNHANDLED("common expression", BeginCommonExpr(0, 0));
  EXPECT_UNHANDLED("common expression", EndCommonExpr(0, TestExpr(), 0));
  EXPECT_UNHANDLED("complementarity constraint",
                   OnComplementarity(0, 0, mp::ComplInfo(0)));
  EXPECT_UNHANDLED("linear objective", OnLinearObjExpr(0, 0));
  EXPECT_UNHANDLED("linear constraint", OnLinearConExpr(0, 0));
  EXPECT_UNHANDLED("linear common expression", OnLinearCommonExpr(0, 0));
  EXPECT_UNHANDLED("variable bounds", OnVarBounds(0, 0, 0));
  EXPECT_UNHANDLED("constraint bounds", OnConBounds(0, 0, 0));
  EXPECT_UNHANDLED("initial value", OnInitialValue(0, 0));
  EXPECT_UNHANDLED("initial dual value", OnInitialDualValue(0, 0));
  EXPECT_UNHANDLED("column sizes", OnColumnSizes());
  EXPECT_UNHANDLED("function", OnFunction(0, "", 0, mp::func::NUMERIC));
  EXPECT_UNHANDLED("integer suffix", OnIntSuffix("",  mp::suf::OBJ, 0));
  EXPECT_UNHANDLED("double suffix", OnDblSuffix("",  mp::suf::OBJ, 0));
  EXPECT_UNHANDLED("number", OnNumber(0));
  EXPECT_UNHANDLED("variable reference", OnVariableRef(0));
  EXPECT_UNHANDLED("common expression reference", OnCommonExprRef(0));
  EXPECT_UNHANDLED("unary expression", OnUnary(expr::MINUS, TestExpr()));
  EXPECT_UNHANDLED("binary expression",
                   OnBinary(expr::ADD, TestExpr(), TestExpr()));
  EXPECT_UNHANDLED("if expression", OnIf(TestExpr(), TestExpr(), TestExpr()));
  EXPECT_UNHANDLED("piecewise-linear term", BeginPLTerm(0));
  EXPECT_UNHANDLED("piecewise-linear term",
                   EndPLTerm(MockNLHandler::PLTermHandler(), TestExpr()));
  EXPECT_UNHANDLED("call expression", BeginCall(0, 0));
  EXPECT_UNHANDLED("call expression", EndCall(MockNLHandler::CallArgHandler()));
  EXPECT_UNHANDLED("vararg expression", BeginVarArg(mp::expr::MIN, 0));
  EXPECT_UNHANDLED("vararg expression",
                   EndVarArg(MockNLHandler::VarArgHandler()));
  EXPECT_UNHANDLED("summation", BeginSum(0));
  EXPECT_UNHANDLED("summation", EndSum(MockNLHandler::NumericArgHandler()));
  EXPECT_UNHANDLED("count expression", BeginCount(0));
  EXPECT_UNHANDLED("count expression",
                   EndCount(MockNLHandler::CountArgHandler()));
  EXPECT_UNHANDLED("numberof expression", BeginNumberOf(0, TestExpr()));
  EXPECT_UNHANDLED("numberof expression",
                   EndNumberOf(MockNLHandler::NumberOfArgHandler()));
  EXPECT_UNHANDLED("symbolic numberof expression",
                   BeginSymbolicNumberOf(0, TestExpr()));
  EXPECT_UNHANDLED("symbolic numberof expression",
                   EndSymbolicNumberOf(MockNLHandler::SymbolicArgHandler()));
  EXPECT_UNHANDLED("bool", OnBool(true));
  EXPECT_UNHANDLED("logical not", OnNot(TestExpr()));
  EXPECT_UNHANDLED("binary logical expression",
                   OnBinaryLogical(mp::expr::OR, TestExpr(), TestExpr()));
  EXPECT_UNHANDLED("relational expression",
                   OnRelational(mp::expr::LT, TestExpr(), TestExpr()));
  EXPECT_UNHANDLED("logical count expression",
                   OnLogicalCount(mp::expr::ATMOST, TestExpr(), TestExpr()));
  EXPECT_UNHANDLED("implication expression",
                   OnImplication(TestExpr(), TestExpr(), TestExpr()));
  EXPECT_UNHANDLED("iterated logical expression",
                   BeginIteratedLogical(mp::expr::EXISTS, 0));
  EXPECT_UNHANDLED("iterated logical expression",
                   EndIteratedLogical(MockNLHandler::LogicalArgHandler()));
  EXPECT_UNHANDLED("pairwise expression",
                   BeginPairwise(mp::expr::ALLDIFF, 0));
  EXPECT_UNHANDLED("pairwise expression",
                   EndPairwise(MockNLHandler::PairwiseArgHandler()));
  EXPECT_UNHANDLED("string", OnString(""));
  EXPECT_UNHANDLED("symbolic if expression",
                   OnSymbolicIf(TestExpr(), TestExpr(), TestExpr()));
}